

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int push_additional_extensions(ptls_handshake_properties_t *properties,ptls_buffer_t *sendbuf)

{
  ushort uVar1;
  ptls_raw_extension_t *ppVar2;
  uint8_t *puVar3;
  size_t sVar4;
  int iVar5;
  ulong uVar6;
  
  if ((properties != (ptls_handshake_properties_t *)0x0) &&
     (ppVar2 = properties->additional_extensions, ppVar2 != (ptls_raw_extension_t *)0x0)) {
    uVar1 = ppVar2->type;
    while (uVar1 != 0xffff) {
      iVar5 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar5 != 0) {
        return iVar5;
      }
      *(ushort *)(sendbuf->base + sendbuf->off) = uVar1 << 8 | uVar1 >> 8;
      sendbuf->off = sendbuf->off + 2;
      iVar5 = ptls_buffer_reserve_aligned(sendbuf,2,'\0');
      if (iVar5 != 0) {
        return iVar5;
      }
      puVar3 = sendbuf->base;
      sVar4 = sendbuf->off;
      (puVar3 + sVar4)[0] = '\0';
      (puVar3 + sVar4)[1] = '\0';
      sVar4 = sendbuf->off;
      sendbuf->off = sVar4 + 2;
      iVar5 = ptls_buffer__do_pushv(sendbuf,(ppVar2->data).base,(ppVar2->data).len);
      if (iVar5 != 0) {
        return iVar5;
      }
      uVar6 = sendbuf->off - (sVar4 + 2);
      if (0xffff < uVar6) {
        return 0x20c;
      }
      sendbuf->base[sVar4] = (uint8_t)(uVar6 >> 8);
      sendbuf->base[sVar4 + 1] = (uint8_t)uVar6;
      uVar1 = ppVar2[1].type;
      ppVar2 = ppVar2 + 1;
    }
  }
  return 0;
}

Assistant:

static int push_additional_extensions(ptls_handshake_properties_t *properties, ptls_buffer_t *sendbuf)
{
    int ret;

    if (properties != NULL && properties->additional_extensions != NULL) {
        ptls_raw_extension_t *ext;
        for (ext = properties->additional_extensions; ext->type != UINT16_MAX; ++ext) {
            buffer_push_extension(sendbuf, ext->type, { ptls_buffer_pushv(sendbuf, ext->data.base, ext->data.len); });
        }
    }
    ret = 0;
Exit:
    return ret;
}